

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept_mdapi.cpp
# Opt level: O2

cl_command_queue __thiscall
CLIntercept::createMDAPICommandQueue
          (CLIntercept *this,cl_context context,cl_device_id device,
          cl_command_queue_properties properties,cl_int *errcode_ret)

{
  bool bVar1;
  uint32_t uVar2;
  cl_platform_id platform;
  CLdispatchX *pCVar3;
  cl_command_queue p_Var4;
  pthread_mutex_t *__mutex;
  float __x;
  float __x_00;
  double dVar5;
  cl_int errorCode;
  cl_int local_6c;
  pthread_mutex_t *local_68;
  allocator local_59;
  string local_58;
  cl_int *local_38;
  
  __mutex = (pthread_mutex_t *)&this->m_Mutex;
  local_38 = errcode_ret;
  std::mutex::lock((mutex *)&__mutex->__data);
  platform = getPlatform(this,device);
  pCVar3 = dispatchX(this,platform);
  if (pCVar3->clCreatePerfCountersCommandQueueINTEL ==
      (_func_cl_command_queue_cl_context_cl_device_id_cl_command_queue_properties_cl_uint_cl_int_ptr
       *)0x0) {
    std::__cxx11::string::string
              ((string *)&local_58,"clCreatePerfCountersCommandQueueINTEL",(allocator *)&local_6c);
    getExtensionFunctionAddress(this,platform,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
  }
  pCVar3 = dispatchX(this,platform);
  if (pCVar3->clCreatePerfCountersCommandQueueINTEL ==
      (_func_cl_command_queue_cl_context_cl_device_id_cl_command_queue_properties_cl_uint_cl_int_ptr
       *)0x0) {
    dVar5 = (double)std::__cxx11::string::string
                              ((string *)&local_58,
                               "Couldn\'t get pointer to clCreatePerfCountersCommandQueueINTEL!\n",
                               (allocator *)&local_6c);
    log(this,dVar5);
  }
  else if (this->m_pMDHelper == (MDHelper *)0x0) {
    dVar5 = (double)std::__cxx11::string::string
                              ((string *)&local_58,"Metrics discovery is not initialized!\n",
                               (allocator *)&local_6c);
    log(this,dVar5);
  }
  else {
    bVar1 = MetricsDiscovery::MDHelper::ActivateMetricSet(this->m_pMDHelper);
    if (bVar1) {
      local_6c = 0;
      local_68 = __mutex;
      uVar2 = MetricsDiscovery::MDHelper::GetMetricsConfiguration(this->m_pMDHelper);
      logf(this,__x);
      p_Var4 = (*pCVar3->clCreatePerfCountersCommandQueueINTEL)
                         (context,device,properties,uVar2,&local_6c);
      __mutex = local_68;
      if (p_Var4 == (cl_command_queue)0x0) {
        CEnumNameMap::name_abi_cxx11_(&local_58,&this->m_EnumNameMap,local_6c);
        logf(this,__x_00);
      }
      else {
        dVar5 = (double)std::__cxx11::string::string
                                  ((string *)&local_58,
                                   "clCreatePerfCountersCommandQueueINTEL succeeded.\n",&local_59);
        log(this,dVar5);
      }
      std::__cxx11::string::~string((string *)&local_58);
      if (local_38 != (cl_int *)0x0) {
        *local_38 = local_6c;
      }
      goto LAB_0018433a;
    }
    dVar5 = (double)std::__cxx11::string::string
                              ((string *)&local_58,
                               "Metric Discovery: Couldn\'t activate metric set!\n",
                               (allocator *)&local_6c);
    log(this,dVar5);
  }
  std::__cxx11::string::~string((string *)&local_58);
  p_Var4 = (cl_command_queue)0x0;
LAB_0018433a:
  pthread_mutex_unlock(__mutex);
  return p_Var4;
}

Assistant:

cl_command_queue CLIntercept::createMDAPICommandQueue(
    cl_context context,
    cl_device_id device,
    cl_command_queue_properties properties,
    cl_int* errcode_ret )
{
    std::lock_guard<std::mutex> lock(m_Mutex);

    cl_command_queue    retVal = NULL;

    cl_platform_id  platform = getPlatform(device);
    if( dispatchX(platform).clCreatePerfCountersCommandQueueINTEL == NULL )
    {
        getExtensionFunctionAddress(
            platform,
            "clCreatePerfCountersCommandQueueINTEL" );
    }

    const auto& dispatchX = this->dispatchX(platform);
    if( dispatchX.clCreatePerfCountersCommandQueueINTEL == NULL )
    {
        log( "Couldn't get pointer to clCreatePerfCountersCommandQueueINTEL!\n" );
    }
    else if( m_pMDHelper == NULL )
    {
        log( "Metrics discovery is not initialized!\n" );
    }
    else if( m_pMDHelper->ActivateMetricSet() )
    {
        cl_int  errorCode = CL_SUCCESS;
        cl_uint configuration = m_pMDHelper->GetMetricsConfiguration();
        logf( "Calling clCreatePerfCountersCommandQueueINTEL with configuration %u....\n",
            configuration);

        retVal = dispatchX.clCreatePerfCountersCommandQueueINTEL(
            context,
            device,
            properties,
            configuration,
            &errorCode );
        if( retVal == NULL )
        {
            logf( "clCreatePerfCountersCommandQueueINTEL returned %s (%d)!\n",
                enumName().name( errorCode ).c_str(),
                errorCode );
        }
        else
        {
            log( "clCreatePerfCountersCommandQueueINTEL succeeded.\n" );
        }
        if( errcode_ret )
        {
            errcode_ret[0] = errorCode;
        }
    }
    else
    {
        log( "Metric Discovery: Couldn't activate metric set!\n" );
    }

    return retVal;
}